

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scorer.cc
# Opt level: O2

void multipredict<&expf>(scorer *param_1,single_learner *base,example *ec,size_t count,
                        size_t param_5,polyprediction *pred,bool finalize_predictions)

{
  bool bVar1;
  float fVar2;
  
  LEARNER::learner<char,_example>::multipredict(base,ec,0,count,pred,finalize_predictions);
  while (bVar1 = count != 0, count = count - 1, bVar1) {
    fVar2 = expf(pred->scalar);
    pred->scalar = fVar2;
    pred = pred + 1;
  }
  return;
}

Assistant:

inline void multipredict(scorer&, LEARNER::single_learner& base, example& ec, size_t count, size_t,
    polyprediction* pred, bool finalize_predictions)
{
  base.multipredict(ec, 0, count, pred, finalize_predictions);  // TODO: need to thread step through???
  for (size_t c = 0; c < count; c++) pred[c].scalar = link(pred[c].scalar);
}